

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

string * duckdb::StringUtil::Format<std::__cxx11::string>
                   (string *fmt_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string local_38 [40];
  string *msg;
  
  msg = in_RDI;
  std::__cxx11::string::string(local_38,in_RDX);
  Exception::ConstructMessage<std::__cxx11::string>(msg,in_RSI);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}